

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O0

void __thiscall LTAircraft::CalcCorrAngle(LTAircraft *this)

{
  bool bVar1;
  Aircraft *in_RDI;
  MovingParam *this_00;
  double corr;
  double headDiff;
  vectorTy vecWind;
  double in_stack_00000058;
  DataRefs *in_stack_00000060;
  double in_stack_ffffffffffffffc8;
  MovingParam *in_stack_ffffffffffffffd0;
  double in_stack_ffffffffffffffd8;
  double local_10;
  
  bVar1 = XPMP2::Aircraft::IsOnGrnd(in_RDI);
  if ((bVar1) || ((char)in_RDI[1].acRadar.size == 'G')) {
    MovingParam::moveTo(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(double)in_RDI);
  }
  else {
    positionTy::alt_m((positionTy *)&in_RDI[1].v_y);
    DataRefs::GetSimWind(in_stack_00000060,in_stack_00000058);
    this_00 = (MovingParam *)
              HeadingDiff(in_stack_ffffffffffffffd8,(double)in_stack_ffffffffffffffd0);
    if ((double)this_00 <= 90.0) {
      if ((double)this_00 < -90.0) {
        this_00 = (MovingParam *)(-180.0 - (double)this_00);
      }
    }
    else {
      this_00 = (MovingParam *)(180.0 - (double)this_00);
    }
    MovingParam::moveTo(this_00,((double)this_00 * local_10) /
                                *(double *)&in_RDI[1].gearDeflectRatio,(double)in_RDI);
  }
  return;
}

Assistant:

void LTAircraft::CalcCorrAngle ()
{
    // correction only applies to flying before flare
    if (!IsOnGrnd() && phase != FPH_FLARE) {
        const vectorTy vecWind = dataRefs.GetSimWind(ppos.alt_m());
        double headDiff = HeadingDiff(vec.angle, vecWind.angle);
        if (headDiff > 90.0)                // if wind comes from behind only consider cross-wind component
            headDiff = 180.0 - headDiff;    // (so that if it comes straight from back (180deg) it would result in 0 correction
        else if (headDiff < -90.0)
            headDiff = -180.0 - headDiff;
        const double corr = headDiff * vecWind.speed / vec.speed;
        corrAngle.moveTo(corr);
    } else {
        // on the ground and while flare: no correction, or actually de-crab
        corrAngle.moveTo(0.0);
    }
}